

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O2

int lj_ccall_func(lua_State *L,GCcdata *cd)

{
  CTSize *pCVar1;
  ushort uVar2;
  uint uVar3;
  CTSize CVar4;
  CTState *cts;
  uint64_t uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  TValue *pTVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  CType *pCVar17;
  FPRArg *pFVar18;
  int iVar19;
  TValue *pTVar20;
  GPRArg *dp;
  CType *pCVar21;
  byte bVar22;
  ulong local_250;
  CType *local_240;
  uint local_230 [2];
  int rcl [2];
  FPRArg *local_208;
  CCallState cc;
  
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  pCVar17 = cts->tab;
  uVar13 = (ulong)pCVar17[cd->ctypeid].info;
  uVar6 = pCVar17[cd->ctypeid].info & 0xf0000000;
  local_240 = pCVar17 + cd->ctypeid;
  if (uVar6 == 0x20000000) {
    pCVar1 = &local_240->size;
    uVar11 = uVar13 & 0xffff;
    uVar13 = (ulong)pCVar17[uVar11].info;
    if ((pCVar17[uVar11].info & 0xf0000000) != 0x60000000) {
      return -1;
    }
    local_240 = pCVar17 + uVar11;
    if (*pCVar1 != 4) goto LAB_00146b6a;
    cc.func = (_func_void *)(ulong)(uint)cd[1].nextgc.gcptr64;
  }
  else {
    if (uVar6 != 0x60000000) {
      return -1;
    }
LAB_00146b6a:
    cc.func = (_func_void *)cd[1].nextgc.gcptr64;
  }
  pTVar12 = L->top;
  memset(cc.fpr,0,0xb0);
  uVar6 = pCVar17[uVar13 & 0xffff].info;
  pCVar17 = pCVar17 + (uVar13 & 0xffff);
  if ((uVar6 & 0xf8000000) == 0x38000000) {
    local_250 = 0;
    if ((pCVar17->size != 8) && (pCVar17->size != 0x10)) {
LAB_00146beb:
      lj_err_caller(L,LJ_ERR_FFI_NYICALL);
    }
  }
  else {
    local_250 = 0;
    if ((uVar6 & 0xf4000000) == 0x34000000 || (uVar6 & 0xf0000000) == 0x10000000) {
      pvVar10 = lj_mem_newgco(L,(ulong)pCVar17->size + 0x10);
      *(undefined1 *)((long)pvVar10 + 9) = 10;
      *(short *)((long)pvVar10 + 10) = (short)uVar13;
      pTVar20 = L->top;
      L->top = pTVar20 + 1;
      pTVar20->u64 = (ulong)pvVar10 | 0xfffa800000000000;
      if ((pCVar17->info & 0xf0000000) == 0x10000000) {
        rcl[0] = 0;
        rcl[1] = 0;
        iVar19 = ccall_classify_struct(cts,pCVar17,rcl,0);
        cc.retref = iVar19 != 0;
        if ((bool)cc.retref) {
          cc.gpr[0] = (long)pvVar10 + 0x10;
        }
        local_250 = (ulong)cc.retref;
      }
      else {
        cc.retref = '\0';
      }
    }
  }
  local_208 = (FPRArg *)cc.gpr;
  uVar9 = (uint)local_240->sib;
  pTVar20 = L->base;
  iVar19 = 1;
  uVar13 = 0;
  uVar6 = 0;
  while( true ) {
    pTVar20 = pTVar20 + 1;
    if (pTVar12 <= pTVar20) break;
    if (uVar9 == 0) {
      if ((local_240->info & 0x800000) == 0) goto LAB_00147356;
      uVar8 = lj_ccall_ctid_vararg(cts,pTVar20);
      pCVar17 = cts->tab;
      uVar9 = 0;
    }
    else {
      pCVar17 = cts->tab;
      uVar8 = (uint)(ushort)pCVar17[uVar9].info;
      uVar9 = (uint)pCVar17[uVar9].sib;
    }
    uVar3 = pCVar17[uVar8].info;
    pCVar17 = pCVar17 + uVar8;
    uVar8 = pCVar17->size;
    if (uVar3 < 0x10000000) {
      if (8 < uVar8) goto LAB_00146beb;
      uVar15 = uVar8 + 7 >> 3;
      uVar16 = uVar15;
      if ((uVar3 >> 0x1a & 1) == 0) goto LAB_00146e84;
      bVar22 = 0;
LAB_00146e64:
      uVar15 = uVar15 + (int)uVar13;
      if (uVar15 < 9) {
        dp = (GPRArg *)(cc.fpr[0].b + uVar13 * 0x10);
        uVar13 = (ulong)uVar15;
      }
      else {
LAB_00146eaf:
        if (0x30000 < (pCVar17->info & 0xf0000)) {
          uVar8 = -1 << ((byte)(pCVar17->info + 0xd0000 >> 0x10) & 0xf);
          uVar6 = uVar6 + ~uVar8 & uVar8;
        }
        if (0x20 < uVar6 + uVar16) goto LAB_00146beb;
        dp = cc.stack + uVar6;
        uVar6 = uVar6 + uVar16;
      }
LAB_00146f09:
      lj_cconv_ct_tv(cts,pCVar17,(uint8_t *)dp,pTVar20,iVar19 << 8);
      if (((pCVar17->info & 0xf4000000) == 0) && (uVar8 = pCVar17->size, uVar8 < 4)) {
        if ((pCVar17->info >> 0x17 & 1) == 0) {
          if (uVar8 == 1) {
            uVar8 = (uint)(char)(byte)*dp;
          }
          else {
            uVar8 = (uint)(short)(ushort)*dp;
          }
        }
        else if (uVar8 == 1) {
          uVar8 = (uint)(byte)*dp;
        }
        else {
          uVar8 = (uint)(ushort)*dp;
        }
        *(uint *)dp = uVar8;
      }
      if (((bool)(bVar22 & uVar16 == 2)) &&
         (dp == (GPRArg *)(cc.fpr[0].b + (ulong)((int)uVar13 - 2) * 0x10))) {
        cc.fpr[(int)uVar13 - 1].d[0] = (double)dp[1];
        dp[1] = 0;
      }
    }
    else {
      if ((uVar3 & 0xf8000000) == 0x38000000) {
        if ((uVar8 == 8) || (uVar8 == 0x10)) {
          bVar22 = 0;
          uVar15 = 1;
          uVar16 = uVar8 + 7 >> 3;
          goto LAB_00146e64;
        }
        goto LAB_00146beb;
      }
      if ((uVar3 & 0xf0000000) != 0x10000000) {
        uVar16 = 1;
        if ((uVar3 & 0xf4000000) == 0x34000000) {
          uVar15 = uVar8 + 7 >> 3;
          bVar22 = 1;
          uVar16 = uVar15;
          goto LAB_00146e64;
        }
LAB_00146e84:
        uVar8 = uVar16 + (int)local_250;
        if (6 < uVar8) {
          bVar22 = 0;
          goto LAB_00146eaf;
        }
        dp = cc.gpr + local_250;
        bVar22 = 0;
        local_250 = (ulong)uVar8;
        goto LAB_00146f09;
      }
      local_230[0] = 0;
      local_230[1] = 0;
      iVar7 = ccall_classify_struct(cts,pCVar17,(int *)local_230,0);
      if (iVar7 != 0) {
        uVar16 = uVar8 + 7 >> 3;
        if (uVar8 + 7 < 0x18) goto LAB_00146e84;
        bVar22 = 0;
        goto LAB_00146eaf;
      }
      cc.ngpr = (uint8_t)local_250;
      rcl[0] = 0;
      rcl[1] = 0;
      cc.nsp = (uint8_t)uVar6;
      cc.nfpr = (uint8_t)uVar13;
      lj_cconv_ct_tv(cts,pCVar17,(uint8_t *)rcl,pTVar20,iVar19 << 8);
      uVar13 = (ulong)cc.nfpr;
      local_250 = (ulong)cc.ngpr;
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        if ((rcl[lVar14 + -2] & 1U) == 0) {
          uVar11 = local_250;
          if ((rcl[lVar14 + -2] & 2U) != 0) {
            if (7 < (uint)uVar13) goto LAB_001470a5;
            cc.fpr[uVar13].d[0] = *(double *)(rcl + lVar14 * 2);
            uVar13 = (ulong)((uint)uVar13 + 1);
          }
        }
        else {
          if (5 < (uint)local_250) {
LAB_001470a5:
            uVar13 = (ulong)cc.nsp;
            iVar7 = 2 - (uint)(local_230[1] == 0);
            uVar6 = iVar7 + (uint)cc.nsp;
            if (0x20 < uVar6) goto LAB_00146beb;
            cc.nsp = (uint8_t)uVar6;
            memcpy(cc.stack + uVar13,rcl,(ulong)(uint)(iVar7 * 8));
            local_250 = (ulong)cc.ngpr;
            uVar13 = (ulong)cc.nfpr;
            goto LAB_001470e8;
          }
          uVar11 = (ulong)((uint)local_250 + 1);
          cc.gpr[local_250] = *(GPRArg *)(rcl + lVar14 * 2);
        }
        local_250 = uVar11;
      }
      cc.ngpr = (uint8_t)local_250;
      cc.nfpr = (uint8_t)uVar13;
LAB_001470e8:
      uVar6 = (uint)cc.nsp;
      local_250 = local_250 & 0xff;
      uVar13 = uVar13 & 0xff;
    }
    iVar19 = iVar19 + 1;
  }
  if (uVar9 != 0) {
LAB_00147356:
    lj_err_caller(L,LJ_ERR_FFI_NUMARG);
  }
  cc.spadj = 8;
  if (1 < uVar6) {
    cc.spadj = uVar6 * 8 | 8;
  }
  pCVar17 = cts->tab;
  (cts->cb).slot = 0xffffffff;
  cc.nsp = (uint8_t)uVar6;
  cc.nfpr = (uint8_t)uVar13;
  lj_vm_ffi_call();
  if ((cts->cb).slot != 0xffffffff) {
    rcl = (int  [2])((ulong)cc.func >> 2);
    pTVar12 = lj_tab_set(L,cts->miscmap,(cTValue *)rcl);
    pTVar12->u64 = 0xfffeffffffffffff;
  }
  pCVar21 = cts->tab;
  uVar2 = *(ushort *)(((long)local_240 - (long)pCVar17) + (long)pCVar21);
  uVar6 = pCVar21[uVar2].info;
  if ((uVar6 & 0xf0000000) == 0x40000000) {
    iVar19 = 0;
    iVar7 = 0;
    goto LAB_00147320;
  }
  pCVar21 = pCVar21 + uVar2;
  if ((uVar6 & 0xf0000000) == 0x10000000) {
    if (cc.retref == '\0') {
      uVar13 = L->top[-1].u64;
      local_230[0] = 0;
      local_230[1] = 0;
      ccall_classify_struct(cts,pCVar21,(int *)local_230,0);
      uVar6 = pCVar21->size;
      uVar9 = 0;
      uVar8 = 0;
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        if ((rcl[lVar14 + -2] & 1U) == 0) {
          if ((rcl[lVar14 + -2] & 2U) != 0) {
            uVar11 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
            pFVar18 = cc.fpr + uVar11;
            goto LAB_00147260;
          }
        }
        else {
          uVar11 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          pFVar18 = (FPRArg *)(cc.gpr + uVar11);
LAB_00147260:
          *(double *)(rcl + lVar14 * 2) = pFVar18->d[0];
        }
      }
      memcpy((void *)((uVar13 & 0x7fffffffffff) + 0x10),rcl,(ulong)uVar6);
    }
LAB_001472d8:
    iVar19 = 1;
    iVar7 = 1;
  }
  else {
    if ((uVar6 & 0xf4000000) == 0x4000000) {
LAB_001472ee:
      local_208 = cc.fpr;
    }
    else {
      if ((uVar6 & 0xf4000000) == 0x34000000) {
        uVar13 = L->top[-1].u64 & 0x7fffffffffff;
        CVar4 = pCVar21->size;
        *(double *)(uVar13 + 0x10) = cc.fpr[0].d[0];
        if (CVar4 != 8) {
          *(double *)(uVar13 + 0x18) = cc.fpr[1].d[0];
        }
        goto LAB_001472d8;
      }
      if ((uVar6 & 0xf8000000) == 0x38000000) goto LAB_001472ee;
    }
    iVar7 = lj_cconv_tv_ct(cts,pCVar21,0,L->top + -1,local_208->b);
    iVar19 = 1;
  }
LAB_00147320:
  for (; 0 < iVar7; iVar7 = iVar7 + -1) {
    uVar5 = (L->glref).ptr64;
    if (*(ulong *)(uVar5 + 0x18) <= *(ulong *)(uVar5 + 0x10)) {
      lj_gc_step(L);
    }
  }
  return iVar19;
}

Assistant:

int lj_ccall_func(lua_State *L, GCcdata *cd)
{
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTSize sz = CTSIZE_PTR;
  if (ctype_isptr(ct->info)) {
    sz = ct->size;
    ct = ctype_rawchild(cts, ct);
  }
  if (ctype_isfunc(ct->info)) {
    CCallState cc;
    int gcsteps, ret;
    cc.func = (void (*)(void))cdata_getptr(cdataptr(cd), sz);
    gcsteps = ccall_set_args(L, cts, ct, &cc);
    ct = (CType *)((intptr_t)ct-(intptr_t)cts->tab);
    cts->cb.slot = ~0u;
    lj_vm_ffi_call(&cc);
    if (cts->cb.slot != ~0u) {  /* Blacklist function that called a callback. */
      TValue tv;
      tv.u64 = ((uintptr_t)(void *)cc.func >> 2) | U64x(800000000, 00000000);
      setboolV(lj_tab_set(L, cts->miscmap, &tv), 1);
    }
    ct = (CType *)((intptr_t)ct+(intptr_t)cts->tab);  /* May be reallocated. */
    gcsteps += ccall_get_results(L, cts, ct, &cc, &ret);
#if LJ_TARGET_X86 && LJ_ABI_WIN
    /* Automatically detect __stdcall and fix up C function declaration. */
    if (cc.spadj && ctype_cconv(ct->info) == CTCC_CDECL) {
      CTF_INSERT(ct->info, CCONV, CTCC_STDCALL);
      lj_trace_abort(G(L));
    }
#endif
    while (gcsteps-- > 0)
      lj_gc_check(L);
    return ret;
  }
  return -1;  /* Not a function. */
}